

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

string * __thiscall
vkb::detail::SurfaceSupportErrorCategory::message_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceSupportErrorCategory *this,int err)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(err) {
  case 0:
    pcVar2 = "surface_handle_null";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "failed_get_surface_capabilities";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "failed_enumerate_surface_formats";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "failed_enumerate_present_modes";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "no_suitable_desired_format";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int err) const override {
        switch (static_cast<SurfaceSupportError>(err)) {
            CASE_TO_STRING(SurfaceSupportError, surface_handle_null)
            CASE_TO_STRING(SurfaceSupportError, failed_get_surface_capabilities)
            CASE_TO_STRING(SurfaceSupportError, failed_enumerate_surface_formats)
            CASE_TO_STRING(SurfaceSupportError, failed_enumerate_present_modes)
            CASE_TO_STRING(SurfaceSupportError, no_suitable_desired_format)
            default:
                return "";
        }
    }